

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kprint.c
# Opt level: O0

void print_NEWstring(LispPTR x)

{
  uint uVar1;
  LispPTR *pLVar2;
  DLword *pDVar3;
  int local_2c;
  ulong uStack_28;
  int i;
  DLbyte *string_base;
  DLword st_length;
  NEWSTRINGP *string_point;
  LispPTR x_local;
  
  pLVar2 = NativeAligned4FromLAddr(x);
  uVar1 = pLVar2[2];
  pDVar3 = NativeAligned2FromLAddr(*pLVar2 & 0xfffffff);
  uStack_28 = (long)pDVar3 + (long)(int)(uint)(ushort)pLVar2[1];
  printf("%c",0x22);
  for (local_2c = 0; local_2c < (int)(uVar1 & 0xffff); local_2c = local_2c + 1) {
    printf("%c",(ulong)*(byte *)(uStack_28 ^ 3));
    uStack_28 = uStack_28 + 1;
  }
  printf("%c",0x22);
  return;
}

Assistant:

void print_NEWstring(LispPTR x) {
  NEWSTRINGP *string_point;
  DLword st_length;
  DLbyte *string_base;

  int i;

  string_point = (NEWSTRINGP *)NativeAligned4FromLAddr(x);
  st_length = string_point->fillpointer;
  string_base = (DLbyte *)NativeAligned2FromLAddr(string_point->base);
  string_base += string_point->offset;

  printf("%c", DOUBLEQUOTE); /* print %" */

  for (i = 0; i < st_length; i++) {
    printf("%c", GETBYTE(string_base));
    string_base++;
  }

  printf("%c", DOUBLEQUOTE); /* print %" */
}